

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

qsizetype __thiscall
QCborStreamReaderPrivate::readStringChunk_unicode
          (QCborStreamReaderPrivate *this,ReadStringChunk params,qsizetype utf8len)

{
  storage_type *__buf;
  QByteArrayView in;
  QByteArrayView in_00;
  bool bVar1;
  long lVar2;
  qsizetype qVar3;
  long lVar4;
  qsizetype qVar5;
  const_iterator pQVar6;
  longlong *plVar7;
  char *pcVar8;
  storage_type *psVar9;
  long in_RCX;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  QString *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  qsizetype size;
  qint64 actuallyRead;
  qsizetype toRead;
  QChar *ptr;
  QChar *begin;
  bad_alloc *anon_var_0;
  size_t newSize;
  qsizetype currentSize;
  qsizetype chunkSize;
  qsizetype StringChunkSize;
  QVarLengthArray<char,_256LL> chunk;
  State cs;
  undefined4 in_stack_fffffffffffffd48;
  Flag in_stack_fffffffffffffd4c;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffd50;
  QChar *in_stack_fffffffffffffd58;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffd60;
  qsizetype in_stack_fffffffffffffd70;
  QIODevice *this_00;
  storage_type *in_stack_fffffffffffffd78;
  QVarLengthArray<char,_256LL> *local_220;
  long local_1d0;
  longlong local_1b0 [5];
  long local_188 [7];
  QVLABase<char> local_150 [11];
  undefined1 local_38 [8];
  long local_30;
  long local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_188[0] = in_RCX;
  qVar3 = QString::size(in_RSI);
  lVar2 = local_188[0];
  lVar4 = local_188[0] + qVar3;
  qVar5 = QString::maxSize();
  if ((qVar5 < lVar2) || (lVar4 < 0)) {
    handleError((QCborStreamReaderPrivate *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
    local_1d0 = -1;
    goto LAB_008da501;
  }
  QString::resize((QString *)in_stack_fffffffffffffd50,
                  CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  pQVar6 = QString::constBegin((QString *)0x8da0bc);
  local_220 = (QVarLengthArray<char,_256LL> *)(pQVar6 + qVar3);
  memset(local_38,0xaa,0x30);
  QFlags<QStringConverterBase::Flag>::QFlags
            ((QFlags<QStringConverterBase::Flag> *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd4c);
  QStringConverterBase::State::State
            ((State *)in_stack_fffffffffffffd50,
             (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
             SUB84((ulong)in_stack_fffffffffffffd58 >> 0x20,0));
  if (*in_RDI == 0) {
    QByteArray::constBegin((QByteArray *)0x8da149);
    QByteArrayView::QByteArrayView<char,_true>
              ((QByteArrayView *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
               (qsizetype)in_stack_fffffffffffffd50);
    in.m_data = in_stack_fffffffffffffd78;
    in.m_size = in_stack_fffffffffffffd70;
    local_220 = (QVarLengthArray<char,_256LL> *)
                QUtf8::convertToUnicode
                          (in_stack_fffffffffffffd58,in,(State *)in_stack_fffffffffffffd50);
    __length = extraout_RDX;
LAB_008da445:
    if ((local_28 == 0) && (local_30 == 0)) {
      QString::truncate(in_RSI,(char *)((long)local_220 - (long)pQVar6 >> 1),__length);
      local_1d0 = ((long)local_220 - (long)pQVar6 >> 1) - qVar3;
    }
    else {
      handleError((QCborStreamReaderPrivate *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      local_1d0 = -1;
    }
  }
  else {
    local_1b0[1] = 0x4000;
    plVar7 = qMin<long_long>(local_1b0 + 1,local_188);
    local_1b0[0] = *plVar7;
    memset(local_150,0xaa,0x118);
    QVarLengthArray<char,_256LL>::QVarLengthArray
              (in_stack_fffffffffffffd60,(qsizetype)in_stack_fffffffffffffd58);
    QFlags<QStringConverterBase::Flag>::QFlags
              ((QFlags<QStringConverterBase::Flag> *)in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd4c);
    QStringConverterBase::State::State
              ((State *)in_stack_fffffffffffffd50,
               (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
               SUB84((ulong)in_stack_fffffffffffffd58 >> 0x20,0));
    QStringConverterBase::State::operator=
              ((State *)in_stack_fffffffffffffd50,
               (State *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QStringConverterBase::State::~State((State *)0x8da277);
    for (; 0 < local_188[0] && local_28 == 0; local_188[0] = local_188[0] - (long)__buf) {
      plVar7 = qMin<long_long>(local_1b0,local_188);
      __buf = (storage_type *)*plVar7;
      this_00 = (QIODevice *)*in_RDI;
      psVar9 = __buf;
      pcVar8 = QVLABase<char>::data(local_150);
      psVar9 = (storage_type *)QIODevice::read(this_00,(int)pcVar8,__buf,(size_t)psVar9);
      if (psVar9 != __buf) {
        handleError((QCborStreamReaderPrivate *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c)
        ;
        local_1d0 = -1;
        bVar1 = true;
        goto LAB_008da425;
      }
      QVLABase<char>::data(local_150);
      QByteArrayView::QByteArrayView<char,_true>
                ((QByteArrayView *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
                 (qsizetype)in_stack_fffffffffffffd50);
      in_00.m_data = psVar9;
      in_00.m_size = (qsizetype)this_00;
      in_stack_fffffffffffffd60 =
           (QVarLengthArray<char,_256LL> *)
           QUtf8::convertToUnicode
                     (in_stack_fffffffffffffd58,in_00,(State *)in_stack_fffffffffffffd50);
      local_220 = in_stack_fffffffffffffd60;
    }
    bVar1 = false;
LAB_008da425:
    QVarLengthArray<char,_256LL>::~QVarLengthArray(in_stack_fffffffffffffd50);
    __length = extraout_RDX_00;
    if (!bVar1) goto LAB_008da445;
  }
  QStringConverterBase::State::~State((State *)0x8da4f0);
LAB_008da501:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1d0;
}

Assistant:

inline qsizetype
QCborStreamReaderPrivate::readStringChunk_unicode(ReadStringChunk params, qsizetype utf8len)
{
    Q_ASSERT(params.isString());

    // See QUtf8::convertToUnicode() a detailed explanation of why this
    // conversion uses the same number of words or less.
    qsizetype currentSize = params.string->size();
    size_t newSize = size_t(utf8len) + size_t(currentSize); // can't overflow
    if (utf8len > QString::maxSize() || qsizetype(newSize) < 0) {
        handleError(CborErrorDataTooLarge);
        return -1;
    }
    QT_TRY {
        params.string->resize(qsizetype(newSize));
    }